

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  char *URL_local;
  
  iVar1 = scopeid();
  if (iVar1 == 0) {
    iVar1 = append();
    if (iVar1 == 0) {
      iVar1 = set_url();
      if (iVar1 == 0) {
        iVar1 = set_parts();
        if (iVar1 == 0) {
          iVar1 = get_url();
          if (iVar1 == 0) {
            iVar1 = get_parts();
            if (iVar1 == 0) {
              curl_mprintf("success\n");
              URL_local._4_4_ = 0;
            }
            else {
              URL_local._4_4_ = 4;
            }
          }
          else {
            URL_local._4_4_ = 3;
          }
        }
        else {
          URL_local._4_4_ = 2;
        }
      }
      else {
        URL_local._4_4_ = 1;
      }
    }
    else {
      URL_local._4_4_ = 5;
    }
  }
  else {
    URL_local._4_4_ = 6;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  (void)URL; /* not used */

  if(scopeid())
    return 6;

  if(append())
    return 5;

  if(set_url())
    return 1;

  if(set_parts())
    return 2;

  if(get_url())
    return 3;

  if(get_parts())
    return 4;

  printf("success\n");
  return 0;
}